

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void SerializeMany<VectorWriter,int,uint256,uint256,unsigned_int,unsigned_int,unsigned_int>
               (VectorWriter *s,int *args,uint256 *args_1,uint256 *args_2,uint *args_3,uint *args_4,
               uint *args_5)

{
  uint256 *__n;
  long in_FS_OFFSET;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = *args;
  __n = args_2;
  VectorWriter::write(s,(int)&local_3c,(void *)0x4,(size_t)args_2);
  VectorWriter::write(s,(int)args_1,(void *)0x20,(size_t)__n);
  VectorWriter::write(s,(int)args_2,(void *)0x20,(size_t)__n);
  local_3c = *args_3;
  VectorWriter::write(s,(int)&local_3c,(void *)0x4,(size_t)__n);
  local_3c = *args_4;
  VectorWriter::write(s,(int)&local_3c,(void *)0x4,(size_t)__n);
  local_3c = *args_5;
  VectorWriter::write(s,(int)&local_3c,(void *)0x4,(size_t)__n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}